

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer puVar1;
  pointer *ppiVar2;
  byte bVar3;
  Sequence *pSVar4;
  _Alloc_hider _Var5;
  pointer ppEVar6;
  pointer ppVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  bool bVar14;
  bool bVar15;
  byte *pbVar16;
  pointer ppVar17;
  int32_t iVar18;
  int32_t iVar19;
  undefined8 this;
  pointer puVar20;
  size_type sVar21;
  int iVar22;
  uint32_t uVar23;
  unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *it;
  undefined8 extraout_RAX;
  undefined7 uVar28;
  ulong uVar24;
  pointer ppNVar25;
  ostream *poVar26;
  Node *pNVar27;
  int *piVar29;
  long lVar30;
  pair<int,_int> *ppVar31;
  unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *it_1;
  pointer puVar32;
  pointer puVar33;
  ulong uVar34;
  char *pcVar35;
  unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_> *it_3;
  pointer puVar36;
  uint uVar37;
  Edge **jt;
  pointer ppEVar38;
  bool bVar39;
  bool bVar40;
  initializer_list<unsigned_char> __l;
  Alignment alignment;
  _Bit_pointer local_378;
  Alignment alignment_rev;
  ulong local_340;
  int32_t score;
  int local_334;
  unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
  sparser;
  int32_t local_324;
  int local_320;
  AlignmentType local_31c;
  int local_318;
  int32_t score_rev;
  vector<bool,_std::allocator<bool>_> is_reversed;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  sequences;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  ulong local_2b0;
  ulong local_2a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> results;
  Graph graph;
  string dot_path;
  string optstr;
  undefined4 *local_190;
  undefined4 local_180;
  uint uStack_17c;
  undefined4 *local_170;
  undefined8 local_168;
  undefined4 local_160;
  uint uStack_15c;
  undefined4 *local_150;
  undefined8 local_148;
  undefined4 local_140;
  undefined2 uStack_13c;
  undefined1 uStack_13a;
  undefined1 uStack_139;
  undefined4 *local_130;
  undefined8 local_128;
  undefined4 local_120;
  undefined4 uStack_11c;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined2 local_f8;
  undefined4 *local_f0;
  undefined8 local_e8;
  undefined4 local_e0;
  undefined2 uStack_dc;
  undefined1 uStack_da;
  undefined1 uStack_d9;
  undefined4 *local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 *local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 *local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined4 uStack_7c;
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined2 local_58;
  string local_50;
  
  graph._0_8_ = graph._0_8_ & 0xffffffffffffff00;
  __l._M_len = 1;
  __l._M_array = (iterator)&graph;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&results,__l,(allocator_type *)&alignment);
  dot_path._M_dataplus._M_p = (pointer)&dot_path.field_2;
  dot_path._M_string_length = 0;
  dot_path.field_2._M_local_buf[0] = '\0';
  optstr._M_dataplus._M_p = (pointer)&optstr.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&optstr,"m:n:g:e:q:c:l:r:d:sh","");
  uVar28 = (undefined7)((ulong)extraout_RAX >> 8);
  local_2b0 = CONCAT71(uVar28,5) & 0xffffffff;
  local_340 = CONCAT71(uVar28,0xf8) & 0xffffffff;
  local_2a8 = CONCAT71(uVar28,0xfa) & 0xffffffff;
  local_334 = (int)CONCAT71(uVar28,0xf6);
  local_318 = (int)CONCAT71(uVar28,0xfc);
  local_324 = -1;
  local_31c = kSW;
  local_320 = 0xfc;
  bVar40 = false;
  do {
    bVar15 = bVar40;
    iVar22 = getopt_long(argc,argv,optstr._M_dataplus._M_p,(anonymous_namespace)::options,0);
    sVar21 = dot_path._M_string_length;
    pcVar35 = _optarg;
    bVar40 = true;
    switch(iVar22) {
    case 99:
      local_318 = atoi(_optarg);
      bVar40 = bVar15;
      break;
    case 100:
      strlen(_optarg);
      std::__cxx11::string::_M_replace((ulong)&dot_path,0,(char *)sVar21,(ulong)pcVar35);
      bVar40 = bVar15;
      break;
    case 0x65:
      uVar37 = atoi(_optarg);
      local_2a8 = (ulong)uVar37;
      bVar40 = bVar15;
      break;
    case 0x66:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6f:
    case 0x70:
    case 0x74:
    case 0x75:
switchD_00103814_caseD_66:
      iVar22 = 1;
LAB_001050b5:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)optstr._M_dataplus._M_p != &optstr.field_2) {
        operator_delete(optstr._M_dataplus._M_p,optstr.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dot_path._M_dataplus._M_p != &dot_path.field_2) {
        operator_delete(dot_path._M_dataplus._M_p,
                        CONCAT71(dot_path.field_2._M_allocated_capacity._1_7_,
                                 dot_path.field_2._M_local_buf[0]) + 1);
      }
      if (results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)results.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)results.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return iVar22;
    case 0x67:
      uVar37 = atoi(_optarg);
      local_340 = (ulong)uVar37;
      bVar40 = bVar15;
      break;
    case 0x68:
      iVar22 = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "usage: spoa [options ...] <sequences>\n\n  # default output is stdout\n  <sequences>\n    input file in FASTA/FASTQ format (can be compressed with gzip)\n\n  options:\n    -m <int>\n      default: 5\n      score for matching bases\n    -n <int>\n      default: -4\n      score for mismatching bases\n    -g <int>\n      default: -8\n      gap opening penalty (must be non-positive)\n    -e <int>\n      default: -6\n      gap extension penalty (must be non-positive)\n    -q <int>\n      default: -10\n      gap opening penalty of the second affine function\n      (must be non-positive)\n    -c <int>\n      default: -4\n      gap extension penalty of the second affine function\n      (must be non-positive)\n    -l, --algorithm <int>\n      default: 0\n      alignment mode:\n        0 - local (Smith-Waterman)\n        1 - global (Needleman-Wunsch)\n        2 - semi-global\n    -r, --result <int> (option can be used multiple times)\n      default: 0\n      result mode:\n        0 - consensus (FASTA)\n        1 - multiple sequence alignment (FASTA)\n        2 - 0 & 1 (FASTA)\n        3 - partial order graph (GFA)\n        4 - 0 & 3 (GFA)\n    --min-coverage <int>\n      default: -1\n      minimal consensus coverage (usable only with -r 0)\n    -d, --dot <file>\n      output file for the partial order graph in DOT format\n    -s, --strand-ambiguous\n      for each sequence pick the strand with the better alignment\n    --version\n      prints the version number\n    -h, --help\n      prints the usage\n\n  gap mode:\n    linear if g >= e\n    affine if g <= q or e >= c\n    convex otherwise (default)\n"
                 ,0x619);
      goto LAB_001050b5;
    case 0x6c:
      local_31c = atoi(_optarg);
      bVar40 = bVar15;
      break;
    case 0x6d:
      uVar37 = atoi(_optarg);
      local_2b0 = (ulong)uVar37;
      bVar40 = bVar15;
      break;
    case 0x6e:
      local_320 = atoi(_optarg);
      bVar40 = bVar15;
      break;
    case 0x71:
      local_334 = atoi(_optarg);
      bVar40 = bVar15;
      break;
    case 0x72:
      uVar23 = atoi(_optarg);
      graph.num_codes_ = uVar23;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
                (&results,(int *)&graph);
      bVar40 = bVar15;
      break;
    case 0x73:
      break;
    case 0x76:
      spoa::Version_abi_cxx11_();
      poVar26 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)graph._0_8_,
                           (long)graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar26 + -0x18) + (char)poVar26);
      std::ostream::put((char)poVar26);
      std::ostream::flush();
      if ((pointer *)graph._0_8_ !=
          &graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete((void *)graph._0_8_,
                        (long)graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish + 1);
      }
      iVar22 = 0;
      goto LAB_001050b5;
    default:
      if (iVar22 != 0x4d) {
        if (iVar22 == -1) {
          if (1 < (ulong)((long)results.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)results.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)) {
            puVar1 = results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1;
            if (puVar1 != results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish) {
              memmove(results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,puVar1,
                      (long)results.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
            }
            results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
          }
          if (_optind < argc) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&alignment,argv[_optind],(allocator<char> *)&is_reversed);
            graph._0_8_ = &graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
            graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x6;
            graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)CONCAT17(graph.coder_.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish._7_1_,0x61747361662e);
            if (alignment.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish < (pointer)0x6) {
              bVar40 = false;
            }
            else {
              iVar22 = std::__cxx11::string::compare
                                 ((ulong)&alignment,
                                  (ulong)((long)&alignment.
                                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                                                 first + 2),(string *)0x6);
              bVar40 = iVar22 == 0;
            }
            bVar39 = true;
            if (bVar40) {
LAB_00103afd:
              bVar14 = false;
              bVar12 = false;
              bVar11 = false;
              bVar10 = false;
              bVar9 = false;
              bVar8 = false;
            }
            else {
              local_70 = &local_60;
              local_60 = 0x672e61747361662e;
              local_58 = 0x7a;
              local_68 = 9;
              if (((pointer)0x8 <
                   alignment.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish) &&
                 (iVar22 = std::__cxx11::string::compare
                                     ((ulong)&alignment,
                                      (ulong)((long)&alignment.
                                                                                                          
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-2].
                                                  second + 3),(string *)0x9), iVar22 == 0))
              goto LAB_00103afd;
              local_170 = &local_160;
              local_160 = 0x616e662e;
              local_168 = 4;
              uStack_15c = uStack_15c & 0xffffff00;
              if ((alignment.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish < (pointer)0x4) ||
                 (iVar22 = std::__cxx11::string::compare
                                     ((ulong)&alignment,
                                      (ulong)&alignment.
                                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish[-1].second,
                                      (string *)0x4), iVar22 != 0)) {
                local_90 = &local_80;
                local_80 = 0x616e662e;
                local_88 = 7;
                uStack_7c = 0x7a672e;
                if (((pointer)0x6 <
                     alignment.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish) &&
                   (iVar22 = std::__cxx11::string::compare
                                       ((ulong)&alignment,
                                        (ulong)((long)&alignment.
                                                                                                              
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                                                  first + 1),(string *)0x7), iVar22 == 0)) {
                  bVar12 = true;
                  goto LAB_00103d70;
                }
                local_190 = &local_180;
                local_180 = 0x6161662e;
                uStack_17c = uStack_17c & 0xffffff00;
                if (((pointer)0x3 <
                     alignment.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish) &&
                   (iVar22 = std::__cxx11::string::compare
                                       ((ulong)&alignment,
                                        (ulong)&alignment.
                                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish[-1].
                                                second,(string *)0x4), iVar22 == 0)) {
                  bVar12 = true;
                  bVar11 = true;
                  goto LAB_00103d82;
                }
                local_b0 = &local_a0;
                local_a0 = 0x6161662e;
                local_a8 = 7;
                uStack_9c = 0x7a672e;
                if (((pointer)0x6 <
                     alignment.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish) &&
                   (iVar22 = std::__cxx11::string::compare
                                       ((ulong)&alignment,
                                        (ulong)((long)&alignment.
                                                                                                              
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                                                  first + 1),(string *)0x7), iVar22 == 0)) {
                  bVar12 = true;
                  bVar11 = true;
                  bVar10 = true;
                  goto LAB_00103d84;
                }
                local_d0 = &local_c0;
                local_c0 = 0x61662e;
                local_c8 = 3;
                if (((pointer)0x2 <
                     alignment.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish) &&
                   (iVar22 = std::__cxx11::string::compare
                                       ((ulong)&alignment,
                                        (ulong)((long)&alignment.
                                                                                                              
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                                                  second + 1),(string *)0x3), iVar22 == 0)) {
                  bVar12 = true;
                  bVar11 = true;
                  bVar10 = true;
                  bVar9 = true;
                  goto LAB_00103d86;
                }
                local_f0 = &local_e0;
                local_e0 = 0x2e61662e;
                uStack_dc = 0x7a67;
                local_e8 = 6;
                uStack_da = 0;
                bVar14 = true;
                if (alignment.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish < (pointer)0x6) {
                  bVar39 = false;
                }
                else {
                  iVar22 = std::__cxx11::string::compare
                                     ((ulong)&alignment,
                                      (ulong)((long)&alignment.
                                                                                                          
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                                                  first + 2),(string *)0x6);
                  bVar39 = iVar22 == 0;
                }
                bVar12 = true;
                bVar11 = true;
                bVar10 = true;
                bVar9 = true;
                bVar8 = true;
              }
              else {
                bVar12 = false;
LAB_00103d70:
                bVar11 = false;
LAB_00103d82:
                bVar10 = false;
LAB_00103d84:
                bVar9 = false;
LAB_00103d86:
                bVar14 = true;
                bVar8 = false;
                bVar39 = true;
              }
            }
            if ((bVar8) && (local_f0 != &local_e0)) {
              operator_delete(local_f0,CONCAT17(uStack_d9,
                                                CONCAT16(uStack_da,CONCAT24(uStack_dc,local_e0))) +
                                       1);
            }
            if ((bVar9) && (local_d0 != &local_c0)) {
              operator_delete(local_d0,CONCAT44(uStack_bc,local_c0) + 1);
            }
            if ((bVar10) && (local_b0 != &local_a0)) {
              operator_delete(local_b0,CONCAT44(uStack_9c,local_a0) + 1);
            }
            if ((bVar11) && (local_190 != &local_180)) {
              operator_delete(local_190,CONCAT44(uStack_17c,local_180) + 1);
            }
            if ((bVar12) && (local_90 != &local_80)) {
              operator_delete(local_90,CONCAT44(uStack_7c,local_80) + 1);
            }
            ppiVar2 = &graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            if ((bVar14) && (local_170 != &local_160)) {
              operator_delete(local_170,CONCAT44(uStack_15c,local_160) + 1);
            }
            if ((!bVar40) && (local_70 != &local_60)) {
              operator_delete(local_70,local_60 + 1);
            }
            if ((pointer *)graph._0_8_ != ppiVar2) {
              operator_delete((void *)graph._0_8_,
                              (long)graph.coder_.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 1);
            }
            if (bVar39) {
              bioparser::Parser<biosoup::Sequence>::Create<bioparser::FastaParser>
                        ((Parser<biosoup::Sequence> *)&sparser,(string *)&alignment);
            }
            else {
              graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x6;
              graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT17(graph.coder_.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._7_1_,0x71747361662e)
              ;
              graph._0_8_ = ppiVar2;
              if (alignment.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish < (pointer)0x6) {
                bVar40 = false;
              }
              else {
                iVar22 = std::__cxx11::string::compare
                                   ((ulong)&alignment,
                                    (ulong)((long)&alignment.
                                                                                                      
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                                                  first + 2),(string *)0x6);
                bVar40 = iVar22 == 0;
              }
              bVar39 = true;
              if (bVar40) {
LAB_00103f39:
                bVar12 = false;
                bVar11 = false;
              }
              else {
                local_110 = &local_100;
                local_100 = 0x672e71747361662e;
                local_f8 = 0x7a;
                local_108 = 9;
                if (((pointer)0x8 <
                     alignment.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish) &&
                   (iVar22 = std::__cxx11::string::compare
                                       ((ulong)&alignment,
                                        (ulong)((long)&alignment.
                                                                                                              
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-2].
                                                  second + 3),(string *)0x9), iVar22 == 0))
                goto LAB_00103f39;
                local_130 = &local_120;
                local_120 = 0x71662e;
                local_128 = 3;
                if ((alignment.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish < (pointer)0x3) ||
                   (iVar22 = std::__cxx11::string::compare
                                       ((ulong)&alignment,
                                        (ulong)((long)&alignment.
                                                                                                              
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                                                  second + 1),(string *)0x3), iVar22 != 0)) {
                  local_150 = &local_140;
                  local_140 = 0x2e71662e;
                  uStack_13c = 0x7a67;
                  local_148 = 6;
                  uStack_13a = 0;
                  bVar12 = true;
                  if (alignment.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish < (pointer)0x6) {
                    bVar39 = false;
                  }
                  else {
                    iVar22 = std::__cxx11::string::compare
                                       ((ulong)&alignment,
                                        (ulong)((long)&alignment.
                                                                                                              
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                                                  first + 2),(string *)0x6);
                    bVar39 = iVar22 == 0;
                  }
                  bVar11 = true;
                }
                else {
                  bVar12 = true;
                  bVar11 = false;
                  bVar39 = true;
                }
              }
              if ((bVar11) && (local_150 != &local_140)) {
                operator_delete(local_150,
                                CONCAT17(uStack_139,
                                         CONCAT16(uStack_13a,CONCAT24(uStack_13c,local_140))) + 1);
              }
              if ((bVar12) && (local_130 != &local_120)) {
                operator_delete(local_130,CONCAT44(uStack_11c,local_120) + 1);
              }
              if ((!bVar40) && (local_110 != &local_100)) {
                operator_delete(local_110,local_100 + 1);
              }
              if ((pointer *)graph._0_8_ != ppiVar2) {
                operator_delete((void *)graph._0_8_,
                                (long)graph.coder_.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish + 1);
              }
              if (bVar39) {
                bioparser::Parser<biosoup::Sequence>::Create<bioparser::FastqParser>
                          ((Parser<biosoup::Sequence> *)&sparser,(string *)&alignment);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"[spoa::CreateParser] error: file ",0x21);
                poVar26 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,
                                     (char *)alignment.
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                     (long)alignment.
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar26," has unsupported format extension (valid extensions: .fasta, ",
                           0x3d);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar26,".fasta.gz, .fna, .fna.gz, .faa, .faa.gz, .fa, .fa.gz, .fastq, ",
                           0x3e);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar26,".fastq.gz, .fq, .fq.gz)",0x17);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar26 + -0x18) + (char)poVar26);
                std::ostream::put((char)poVar26);
                std::ostream::flush();
                sparser._M_t.
                super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl =
                     (__uniq_ptr_data<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>,_true,_true>
                      )(__uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                        )0x0;
              }
            }
            if (alignment.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (pointer)&alignment.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(alignment.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)&(alignment.
                                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             first + 1));
            }
            if ((__uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                 )sparser._M_t.
                  super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                  .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl
                == (__uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                    )0x0) {
              iVar22 = 1;
            }
            else {
              spoa::AlignmentEngine::Create
                        ((AlignmentEngine *)&graph,local_31c & 0xff,(int8_t)local_2b0,
                         (int8_t)local_320,(int8_t)local_340,(int8_t)local_2a8,(int8_t)local_334,
                         (int8_t)local_318);
              this = graph._0_8_;
              sequences.
              super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              sequences.
              super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              sequences.
              super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (**(code **)(*(long *)sparser._M_t.
                                    super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                                    .
                                    super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>
                                    ._M_head_impl + 0x10))
                        (&alignment,
                         sparser._M_t.
                         super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                         .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>.
                         _M_head_impl,0xffffffffffffffff,1);
              graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)sequences.
                            super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              graph.coder_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)sequences.
                            super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              graph._0_8_ = sequences.
                            super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              sequences.
              super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)alignment.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              sequences.
              super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)alignment.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              sequences.
              super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)alignment.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              alignment.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)0x0;
              alignment.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)0x0;
              alignment.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                         *)&graph);
              std::
              vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                         *)&alignment);
              uVar24 = 0;
              for (puVar32 = sequences.
                             super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  puVar32 !=
                  sequences.
                  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; puVar32 = puVar32 + 1) {
                uVar34 = (((puVar32->_M_t).
                           super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                           .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)->data).
                         _M_string_length;
                if (uVar34 < uVar24) {
                  uVar34 = uVar24;
                }
                uVar24 = uVar34;
              }
              (**(code **)(*(long *)this + 0x10))(this,uVar24,4);
              spoa::Graph::Graph(&graph);
              puVar32 = sequences.
                        super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
              is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
              is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
              bVar40 = sequences.
                       super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start ==
                       sequences.
                       super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (!bVar40) {
                puVar33 = sequences.
                          super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  score = 0;
                  alignment.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  alignment.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  alignment.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  spoa::AlignmentEngine::Align
                            (&alignment_rev,(AlignmentEngine *)this,
                             &((puVar33->_M_t).
                               super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                               .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)->
                              data,&graph,&score);
                  ppVar17 = alignment.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  ppVar7 = alignment.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  alignment.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       alignment_rev.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  alignment.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       alignment_rev.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  alignment.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                       alignment_rev.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  alignment_rev.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
                  alignment_rev.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (ppVar7 != (pointer)0x0) {
                    operator_delete(ppVar7,(long)ppVar17 - (long)ppVar7);
                  }
                  if (alignment_rev.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(alignment_rev.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)alignment_rev.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)alignment_rev.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (bVar15) {
                    biosoup::Sequence::ReverseAndComplement
                              ((puVar33->_M_t).
                               super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                               .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl);
                    score_rev = 0;
                    alignment_rev.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
                    alignment_rev.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    spoa::AlignmentEngine::Align
                              ((Alignment *)&headers,(AlignmentEngine *)this,
                               &((puVar33->_M_t).
                                 super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                                 .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)->
                                data,&graph,&score_rev);
                    ppVar17 = alignment_rev.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    ppVar7 = alignment_rev.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    alignment_rev.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)headers.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                    alignment_rev.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         (pointer)headers.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                    alignment_rev.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)headers.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    headers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
                    headers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    if (ppVar7 != (pointer)0x0) {
                      operator_delete(ppVar7,(long)ppVar17 - (long)ppVar7);
                    }
                    if (headers.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(headers.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)headers.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)headers.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    iVar19 = score_rev;
                    iVar18 = score;
                    if (score < score_rev) {
                      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                      operator=(&alignment,&alignment_rev);
                    }
                    else {
                      biosoup::Sequence::ReverseAndComplement
                                ((puVar33->_M_t).
                                 super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                                 .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl);
                    }
                    std::vector<bool,_std::allocator<bool>_>::push_back
                              (&is_reversed,iVar18 < iVar19);
                    if (alignment_rev.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(alignment_rev.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)alignment_rev.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)alignment_rev.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  pSVar4 = (puVar33->_M_t).
                           super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                           .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl;
                  if ((pSVar4->quality)._M_string_length == 0) {
                    spoa::Graph::AddAlignment(&graph,&alignment,&pSVar4->data,1);
                  }
                  else {
                    spoa::Graph::AddAlignment(&graph,&alignment,&pSVar4->data,&pSVar4->quality);
                  }
                  if (alignment.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(alignment.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)alignment.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)alignment.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  puVar33 = puVar33 + 1;
                  bVar40 = puVar33 == puVar32;
                } while (!bVar40);
              }
              puVar1 = results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              puVar32 = sequences.
                        super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar33 = sequences.
                        super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pbVar16 = results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (bVar40) {
                for (; sequences.
                       super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start = puVar32,
                    sequences.
                    super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = puVar33, pbVar16 != puVar1;
                    pbVar16 = pbVar16 + 1) {
                  bVar3 = *pbVar16;
                  if (bVar3 - 1 < 2) {
                    spoa::Graph::GenerateMultipleSequenceAlignment_abi_cxx11_
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&alignment_rev,&graph,*pbVar16 == 2);
                    if (alignment_rev.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish !=
                        alignment_rev.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                      uVar24 = 0;
                      uVar34 = 1;
                      do {
                        if (uVar24 < (ulong)((long)sequences.
                                                                                                      
                                                  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)sequences.
                                                                                                      
                                                  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3)) {
                          pSVar4 = sequences.
                                   super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar24]._M_t.
                                   super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                                   .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl;
                          alignment.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start =
                               (pointer)&alignment.
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          _Var5._M_p = (pSVar4->name)._M_dataplus._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&alignment,_Var5._M_p,
                                     _Var5._M_p + (pSVar4->name)._M_string_length);
                        }
                        else {
                          alignment.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start =
                               (pointer)&alignment.
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&alignment,"Consensus","");
                        }
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,">",1);
                        poVar26 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             (char *)alignment.
                                                                                                          
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                             (long)alignment.
                                                                                                      
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                        std::ios::widen((char)*(undefined8 *)(*(long *)poVar26 + -0x18) +
                                        (char)poVar26);
                        std::ostream::put((char)poVar26);
                        poVar26 = (ostream *)std::ostream::flush();
                        poVar26 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar26,(char *)alignment_rev.
                                                                                                                          
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar24 * 4],
                                             (long)alignment_rev.
                                                                                                      
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar24 * 4 + 1]);
                        std::ios::widen((char)*(undefined8 *)(*(long *)poVar26 + -0x18) +
                                        (char)poVar26);
                        std::ostream::put((char)poVar26);
                        std::ostream::flush();
                        if (alignment.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            (pointer)&alignment.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          operator_delete(alignment.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (ulong)((long)&(alignment.
                                                                                                                    
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->first + 1));
                        }
                        bVar40 = uVar34 < (ulong)((long)alignment_rev.
                                                                                                                
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)alignment_rev.
                                                                                                                
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5);
                        uVar24 = uVar34;
                        uVar34 = (ulong)((int)uVar34 + 1);
                      } while (bVar40);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&alignment_rev);
                  }
                  else if (bVar3 - 3 < 2) {
                    headers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
                    headers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    for (; puVar32 != puVar33; puVar32 = puVar32 + 1) {
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&headers,
                                 &((puVar32->_M_t).
                                   super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                                   .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)
                                  ->name);
                    }
                    spoa::Graph::GenerateConsensus_abi_cxx11_(&local_50,&graph);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p,
                                      local_50.field_2._M_allocated_capacity + 1);
                    }
                    uVar24 = (long)graph.sequences_.
                                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)graph.sequences_.
                                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3;
                    lVar30 = 0x29;
                    pcVar35 = "[spoa::PrintGfa] error: missing header(s)";
                    if ((ulong)((long)headers.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)headers.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar24) {
LAB_00104965:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,pcVar35,lVar30);
                      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
                      std::ostream::put('(');
                      std::ostream::flush();
                    }
                    else {
                      local_334 = CONCAT31(local_334._1_3_,*pbVar16);
                      if (is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                          is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p ||
                          is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0
                         ) {
                        lVar30 = 0x31;
                        pcVar35 = "[spoa::PringGfa] error: missing reversion flag(s)";
                        if ((ulong)is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                   _M_offset +
                            ((long)is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                            - (long)is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                            * 8 < uVar24) goto LAB_00104965;
                      }
                      auVar13[0xf] = 0;
                      auVar13._0_15_ =
                           (undefined1  [15])
                           alignment_rev.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._1_15_;
                      alignment_rev.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._0_16_ = auVar13 << 8;
                      std::vector<bool,_std::allocator<bool>_>::vector
                                ((vector<bool,_std::allocator<bool>_> *)&alignment,
                                 (long)graph.nodes_.
                                       super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)graph.nodes_.
                                       super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                                 (bool *)&alignment_rev,(allocator_type *)&score);
                      for (ppNVar25 = graph.consensus_.
                                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                          ppNVar25 !=
                          graph.consensus_.
                          super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish; ppNVar25 = ppNVar25 + 1) {
                        alignment.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(*ppNVar25)->id >> 6] =
                             (pair<int,_int>)
                             ((ulong)alignment.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(*ppNVar25)->id >> 6]
                             | 1L << ((ulong)(*ppNVar25)->id & 0x3f));
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"H\tVN:Z:1.0",10);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                      std::ostream::put(' ');
                      std::ostream::flush();
                      puVar20 = graph.nodes_.
                                super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      for (puVar36 = graph.nodes_.
                                     super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start; puVar36 != puVar20;
                          puVar36 = puVar36 + 1) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"S\t",2);
                        poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar26,"\t",1);
                        alignment_rev.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_1_ =
                             (char)graph.decoder_.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [(byte)((puVar36->_M_t).
                                           super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                                           .super__Head_base<0UL,_spoa::Graph::Node_*,_false>.
                                          _M_head_impl)->code];
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar26,(char *)&alignment_rev,1);
                        uVar37 = ((puVar36->_M_t).
                                  super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                                  .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl)->
                                 id;
                        if (((ulong)alignment.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar37 >> 6] >>
                             ((ulong)uVar37 & 0x3f) & 1) != 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"\tic:Z:true",10);
                        }
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                        std::ostream::put(' ');
                        std::ostream::flush();
                        pNVar27 = (puVar36->_M_t).
                                  super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                                  .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
                        ppEVar6 = *(pointer *)
                                   ((long)&(pNVar27->outedges).
                                           super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                   + 8);
                        for (ppEVar38 = *(pointer *)
                                         &(pNVar27->outedges).
                                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                          ._M_impl; ppEVar38 != ppEVar6; ppEVar38 = ppEVar38 + 1) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"L\t",2);
                          poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar26,"\t",1);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar26,"+\t",2);
                          poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)poVar26);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar26,"\t",1);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar26,"+\t",2);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar26,"OM\t",3);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar26,"ew:f:",5);
                          std::ostream::_M_insert<long>((long)poVar26);
                          uVar37 = ((puVar36->_M_t).
                                    super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                                    .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl)
                                   ->id;
                          if ((((ulong)alignment.
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar37 >> 6] >>
                                ((ulong)uVar37 & 0x3f) & 1) != 0) &&
                             (uVar37 = (*ppEVar38)->head->id,
                             ((ulong)alignment.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar37 >> 6] >>
                              ((ulong)uVar37 & 0x3f) & 1) != 0)) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,"\tic:Z:true",10);
                          }
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                          std::ostream::put(' ');
                          std::ostream::flush();
                        }
                      }
                      if (graph.sequences_.
                          super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          graph.sequences_.
                          super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
                        uVar24 = 0;
                        do {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"P\t",2);
                          poVar26 = std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,
                                               headers.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                               _M_dataplus._M_p,
                                               headers.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                               _M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar26,"\t",1);
                          alignment_rev.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
                          alignment_rev.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          pNVar27 = graph.sequences_.
                                    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar24];
                          do {
                            score = pNVar27->id + 1;
                            if (alignment_rev.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish ==
                                alignment_rev.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                              _M_realloc_insert<unsigned_int>
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         &alignment_rev,
                                         (iterator)
                                         alignment_rev.
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,(uint *)&score);
                            }
                            else {
                              (alignment_rev.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->first = score;
                              alignment_rev.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish =
                                   (pointer)&(alignment_rev.
                                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish)->second;
                            }
                            pNVar27 = spoa::Graph::Node::Successor(pNVar27,(uint32_t)uVar24);
                          } while (pNVar27 != (Node *)0x0);
                          if ((is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
                               is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
                             (is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                              == 0)) {
                            bVar40 = false;
                          }
                          else {
                            bVar40 = (is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl
                                      .super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0;
                          }
                          if ((bVar40) &&
                             (ppVar31 = (pair<int,_int> *)
                                        &alignment_rev.
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish[-1].second,
                             ppVar7 = alignment_rev.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                             alignment_rev.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start < ppVar31 &&
                             alignment_rev.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start !=
                             alignment_rev.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)) {
                            do {
                              piVar29 = &ppVar7->second;
                              iVar22 = ppVar7->first;
                              ppVar7->first = ppVar31->first;
                              ppVar31->first = iVar22;
                              ppVar31 = (pair<int,_int> *)((long)(ppVar31 + 0xffffffffffffffff) + 4)
                              ;
                              ppVar7 = (pointer)piVar29;
                            } while (piVar29 < ppVar31);
                          }
                          if (alignment_rev.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish !=
                              alignment_rev.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) {
                            pcVar35 = "+";
                            if (bVar40) {
                              pcVar35 = "-";
                            }
                            uVar37 = 1;
                            do {
                              if (uVar37 != 1) {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,",",1);
                              }
                              poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar26,pcVar35,1);
                              uVar34 = (ulong)uVar37;
                              uVar37 = uVar37 + 1;
                            } while (uVar34 < (ulong)((long)alignment_rev.
                                                                                                                        
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)alignment_rev.
                                                                                                                
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2));
                          }
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"\t*",2);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                          std::ostream::put(' ');
                          std::ostream::flush();
                          if (alignment_rev.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(alignment_rev.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)alignment_rev.
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)alignment_rev.
                                                                                                        
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          uVar24 = (ulong)((uint32_t)uVar24 + 1);
                        } while (uVar24 < (ulong)((long)graph.sequences_.
                                                                                                                
                                                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)graph.sequences_.
                                                                                                                
                                                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3));
                      }
                      if ((int8_t)local_334 == '\x04') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"P\tConsensus\t",0xc);
                        if (graph.consensus_.
                            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish !=
                            graph.consensus_.
                            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
                          uVar24 = 1;
                          do {
                            if ((int)uVar24 != 1) {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,",",1);
                            }
                            poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"+",1);
                            bVar40 = uVar24 < (ulong)((long)graph.consensus_.
                                                                                                                        
                                                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)graph.consensus_.
                                                                                                                
                                                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3);
                            uVar24 = (ulong)((int)uVar24 + 1);
                          } while (bVar40);
                        }
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"\t*",2);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
                        std::ostream::put(' ');
                        std::ostream::flush();
                      }
                      if (alignment.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(alignment.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_378 -
                                        (long)alignment.
                                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                        alignment.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        alignment.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             (pointer)((ulong)alignment.
                                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish &
                                      0xffffffff00000000);
                        alignment.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        local_378 = (_Bit_pointer)0x0;
                      }
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&headers);
                  }
                  else if (bVar3 == 0) {
                    spoa::Graph::GenerateConsensus_abi_cxx11_((string *)&alignment,&graph,local_324)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,">Consensus LN:i:",0x10);
                    poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar26 + -0x18) + (char)poVar26)
                    ;
                    std::ostream::put((char)poVar26);
                    poVar26 = (ostream *)std::ostream::flush();
                    poVar26 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar26,(char *)alignment.
                                                                                                                  
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                         (long)alignment.
                                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar26 + -0x18) + (char)poVar26)
                    ;
                    std::ostream::put((char)poVar26);
                    std::ostream::flush();
                    if (alignment.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        (pointer)&alignment.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      operator_delete(alignment.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (ulong)((long)&(alignment.
                                                                                                            
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->first + 1));
                    }
                  }
                  puVar32 = sequences.
                            super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar33 = sequences.
                            super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                spoa::Graph::PrintDot(&graph,&dot_path);
              }
              iVar22 = 0;
              if (is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  (_Bit_type *)0x0) {
                operator_delete(is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                                (long)is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl
                                      .super__Bvector_impl_data._M_end_of_storage -
                                (long)is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl
                                      .super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p);
                is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
                is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
                is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
              }
              spoa::Graph::~Graph(&graph);
              std::
              vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ::~vector(&sequences);
              if (this != 0) {
                (**(code **)(*(long *)this + 8))();
              }
            }
            if ((__uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                 )sparser._M_t.
                  super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                  .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl
                != (__uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                    )0x0) {
              (**(code **)(*(long *)sparser._M_t.
                                    super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                                    .
                                    super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>
                                    ._M_head_impl + 8))();
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"[spoa::] error: missing input file!",0x23);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
            std::ostream::put('(');
            std::ostream::flush();
            iVar22 = 1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "usage: spoa [options ...] <sequences>\n\n  # default output is stdout\n  <sequences>\n    input file in FASTA/FASTQ format (can be compressed with gzip)\n\n  options:\n    -m <int>\n      default: 5\n      score for matching bases\n    -n <int>\n      default: -4\n      score for mismatching bases\n    -g <int>\n      default: -8\n      gap opening penalty (must be non-positive)\n    -e <int>\n      default: -6\n      gap extension penalty (must be non-positive)\n    -q <int>\n      default: -10\n      gap opening penalty of the second affine function\n      (must be non-positive)\n    -c <int>\n      default: -4\n      gap extension penalty of the second affine function\n      (must be non-positive)\n    -l, --algorithm <int>\n      default: 0\n      alignment mode:\n        0 - local (Smith-Waterman)\n        1 - global (Needleman-Wunsch)\n        2 - semi-global\n    -r, --result <int> (option can be used multiple times)\n      default: 0\n      result mode:\n        0 - consensus (FASTA)\n        1 - multiple sequence alignment (FASTA)\n        2 - 0 & 1 (FASTA)\n        3 - partial order graph (GFA)\n        4 - 0 & 3 (GFA)\n    --min-coverage <int>\n      default: -1\n      minimal consensus coverage (usable only with -r 0)\n    -d, --dot <file>\n      output file for the partial order graph in DOT format\n    -s, --strand-ambiguous\n      for each sequence pick the strand with the better alignment\n    --version\n      prints the version number\n    -h, --help\n      prints the usage\n\n  gap mode:\n    linear if g >= e\n    affine if g <= q or e >= c\n    convex otherwise (default)\n"
                       ,0x619);
          }
          goto LAB_001050b5;
        }
        goto switchD_00103814_caseD_66;
      }
      local_324 = atoi(_optarg);
      bVar40 = bVar15;
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  std::int8_t m = 5;
  std::int8_t n = -4;
  std::int8_t g = -8;
  std::int8_t e = -6;
  std::int8_t q = -10;
  std::int8_t c = -4;

  std::int32_t min_coverage = -1;

  std::uint8_t algorithm = 0;
  std::vector<std::uint8_t> results = { 0 };
  std::string dot_path{};
  bool is_strand_ambiguous = false;

  std::string optstr = "m:n:g:e:q:c:l:r:d:sh";
  int opt;
  while ((opt = getopt_long(argc, argv, optstr.c_str(), options, nullptr)) != -1) {  // NOLINT
    switch (opt) {
      case 'm': m = atoi(optarg); break;
      case 'n': n = atoi(optarg); break;
      case 'g': g = atoi(optarg); break;
      case 'e': e = atoi(optarg); break;
      case 'q': q = atoi(optarg); break;
      case 'c': c = atoi(optarg); break;
      case 'M': min_coverage = atoi(optarg); break;
      case 'l': algorithm = atoi(optarg); break;
      case 'r': results.emplace_back(atoi(optarg)); break;
      case 'd': dot_path = optarg; break;
      case 's': is_strand_ambiguous = true; break;
      case 'v': std::cout << spoa::Version() << std::endl; return 0;
      case 'h': Help(); return 0;
      default: return 1;
    }
  }
  if (results.size() > 1) {
    results.erase(results.begin());
  }

  if (optind >= argc) {
    std::cerr << "[spoa::] error: missing input file!" << std::endl;
    Help();
    return 1;
  }

  auto sparser = CreateParser(argv[optind]);
  if (sparser == nullptr) {
    return 1;
  }

  std::unique_ptr<spoa::AlignmentEngine> alignment_engine;
  try {
    alignment_engine = spoa::AlignmentEngine::Create(
        static_cast<spoa::AlignmentType>(algorithm), m, n, g, e, q, c);
  } catch(std::invalid_argument& exception) {
    std::cerr << exception.what() << std::endl;
    return 1;
  }

  std::vector<std::unique_ptr<biosoup::Sequence>> sequences;
  sequences = sparser->Parse(-1);

  std::size_t max_sequence_len = 0;
  for (const auto& it : sequences) {
    max_sequence_len = std::max(max_sequence_len, it->data.size());
  }
  try {
    alignment_engine->Prealloc(max_sequence_len, 4);
  } catch (std::invalid_argument& exception) {
    std::cerr << exception.what() << std::endl;
    return 1;
  }

  spoa::Graph graph{};
  std::vector<bool> is_reversed;
  for (const auto& it : sequences) {
    std::int32_t score = 0;
    spoa::Alignment alignment;
    try {
      alignment = alignment_engine->Align(it->data, graph, &score);
    } catch (std::invalid_argument& exception) {
      std::cerr << exception.what() << std::endl;
      return 1;
    }

    if (is_strand_ambiguous) {
      it->ReverseAndComplement();
      std::int32_t score_rev = 0;
      spoa::Alignment alignment_rev;
      try {
        alignment_rev = alignment_engine->Align(it->data, graph, &score_rev);
      } catch (std::invalid_argument& exception) {
        std::cerr << exception.what() << std::endl;
        return 1;
      }
      if (score >= score_rev) {
        it->ReverseAndComplement();
        is_reversed.push_back(false);
      } else {
        alignment = alignment_rev;
        is_reversed.push_back(true);
      }
    }

    try {
      if (it->quality.empty()) {
        graph.AddAlignment(alignment, it->data);
      } else {
        graph.AddAlignment(alignment, it->data, it->quality);
      }
    } catch(std::invalid_argument& exception) {
      std::cerr << exception.what() << std::endl;
      return 1;
    }
  }

  for (const auto& it : results) {
    switch (it) {
      case 0: {
        auto consensus = graph.GenerateConsensus(min_coverage);
        std::cout << ">Consensus LN:i:" << consensus.size() << std::endl
                  << consensus << std::endl;
        break;
      }
      case 1:
      case 2: {
        auto msa = graph.GenerateMultipleSequenceAlignment(it == 2);
        for (std::uint32_t i = 0; i < msa.size(); ++i) {
          std::string name = i < sequences.size() ? sequences[i]->name : "Consensus";  // NOLINT
          std::cout << ">" << name << std::endl
                    << msa[i] << std::endl;
        }
        break;
      }
      case 3:
      case 4: {
        std::vector<std::string> headers;
        for (const auto& it : sequences) {
          headers.emplace_back(it->name);
        }
        graph.GenerateConsensus();
        PrintGfa(graph, headers, is_reversed, it == 4);
        break;
      }
      default:
        break;
    }
  }

  graph.PrintDot(dot_path);

  return 0;
}